

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdns.c
# Opt level: O0

int mdns_string_skip(void *buffer,size_t size,size_t *offset)

{
  mdns_string_pair_t local_60;
  mdns_string_pair_t substr;
  size_t cur;
  size_t *offset_local;
  size_t size_local;
  void *buffer_local;
  
  substr._16_8_ = *offset;
  while( true ) {
    mdns_get_next_substring(&local_60,buffer,size,substr._16_8_);
    if (local_60.offset == 0xffffffffffffffff) {
      return 0;
    }
    substr.length._0_4_ = local_60.ref;
    if ((int)substr.length != 0) break;
    substr._16_8_ = local_60.offset + local_60.length;
    if (local_60.length == 0) {
      *offset = substr._16_8_ + 1;
      return 1;
    }
  }
  *offset = substr._16_8_ + 2;
  return 1;
}

Assistant:

int
mdns_string_skip(const void* buffer, size_t size, size_t* offset) {
	size_t cur = *offset;
	mdns_string_pair_t substr;
	do {
		substr = mdns_get_next_substring(buffer, size, cur);
		if (substr.offset == MDNS_INVALID_POS)
			return 0;
		if (substr.ref) {
			*offset = cur + 2;
			return 1;
		}
		cur = substr.offset + substr.length;
	}
	while (substr.length);

	*offset = cur + 1;
	return 1;
}